

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_compat.c
# Opt level: O1

char * old_create_multityped_action_spec
                 (CMFormatList *input_format_lists,CMFormatList out_format_list,char *function)

{
  long *plVar1;
  undefined8 *puVar2;
  FMFieldList p_Var3;
  int iVar4;
  FMStructDescList *input_format_lists_00;
  CMFormatList pCVar5;
  FMStructDescList p_Var6;
  CMFormatList pCVar7;
  void *pvVar8;
  char *pcVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  CMFormatList pCVar13;
  uint uVar14;
  long lVar15;
  
  lVar15 = 1;
  uVar11 = 0;
  do {
    lVar15 = lVar15 + -1;
    plVar1 = (long *)((long)input_format_lists + uVar11);
    uVar11 = uVar11 + 8;
  } while (*plVar1 != 0);
  pCVar13 = out_format_list;
  input_format_lists_00 = (FMStructDescList *)INT_CMmalloc(uVar11 & 0x7fffffff8);
  if (lVar15 != 0) {
    lVar10 = 0;
    do {
      pCVar7 = input_format_lists[lVar10];
      uVar14 = 0;
      if (pCVar7 != (CMFormatList)0x0) {
        uVar14 = 0;
        pCVar5 = pCVar7;
        do {
          if (pCVar5->format_name == (char *)0x0) break;
          uVar14 = uVar14 + 1;
          pCVar5 = pCVar5 + 1;
        } while (pCVar7 != (CMFormatList)0x0);
      }
      uVar11 = (ulong)uVar14;
      p_Var6 = (FMStructDescList)INT_CMmalloc(uVar11 * 0x20 + 0x20);
      if (uVar14 != 0) {
        lVar12 = 0;
        do {
          *(undefined8 *)((long)&p_Var6->format_name + lVar12 * 2) =
               *(undefined8 *)((long)&pCVar7->format_name + lVar12);
          p_Var3 = *(FMFieldList *)((long)&pCVar7->field_list + lVar12);
          *(FMFieldList *)((long)&p_Var6->field_list + lVar12 * 2) = p_Var3;
          iVar4 = struct_size_field_list(p_Var3,(int)pCVar13);
          *(int *)((long)&p_Var6->struct_size + lVar12 * 2) = iVar4;
          *(undefined8 *)((long)&p_Var6->opt_info + lVar12 * 2) = 0;
          lVar12 = lVar12 + 0x10;
        } while (uVar11 << 4 != lVar12);
      }
      p_Var6[uVar11].format_name = (char *)0x0;
      p_Var6[uVar11].field_list = (FMFieldList)0x0;
      input_format_lists_00[lVar10] = p_Var6;
      lVar10 = lVar10 + 1;
    } while (-lVar15 != lVar10);
  }
  uVar14 = 0;
  for (pCVar7 = out_format_list;
      (out_format_list != (CMFormatList)0x0 && (pCVar7->format_name != (char *)0x0));
      pCVar7 = pCVar7 + 1) {
    uVar14 = uVar14 + 1;
  }
  uVar11 = (ulong)uVar14;
  pvVar8 = INT_CMmalloc(uVar11 * 0x20 + 0x20);
  if (uVar14 != 0) {
    lVar15 = 0;
    do {
      *(undefined8 *)((long)pvVar8 + lVar15 * 2) =
           *(undefined8 *)((long)&out_format_list->format_name + lVar15);
      p_Var3 = *(FMFieldList *)((long)&out_format_list->field_list + lVar15);
      *(FMFieldList *)((long)pvVar8 + lVar15 * 2 + 8) = p_Var3;
      iVar4 = struct_size_field_list(p_Var3,(int)pCVar13);
      *(int *)((long)pvVar8 + lVar15 * 2 + 0x10) = iVar4;
      *(undefined8 *)((long)pvVar8 + lVar15 * 2 + 0x18) = 0;
      lVar15 = lVar15 + 0x10;
    } while (uVar11 << 4 != lVar15);
  }
  puVar2 = (undefined8 *)((long)pvVar8 + uVar11 * 0x20);
  *puVar2 = 0;
  puVar2[1] = 0;
  pcVar9 = create_multityped_action_spec(input_format_lists_00,function);
  return pcVar9;
}

Assistant:

extern char*
old_create_multityped_action_spec(CMFormatList *input_format_lists, CMFormatList out_format_list, char *function)
{
    FMStructDescList structs, out_structs, *struct_list;
    int struct_count = 0, j;
    int count, i;
    while (input_format_lists[struct_count] != NULL) struct_count++;
    struct_list = malloc(sizeof(struct_list[0]) * (struct_count+1));
    for (j = 0; j < struct_count ; j++) {
	CMFormatList format_list = input_format_lists[j];
	count = 0;
	while (format_list && (format_list[count].format_name != NULL)) count++;
	structs = malloc(sizeof(structs[0]) * (count + 1));
	for (i = 0; i < count; i++) {
	    structs[i].format_name = format_list[i].format_name;
	    structs[i].field_list = format_list[i].field_list;
	    structs[i].struct_size = struct_size_field_list(structs[i].field_list, (int)sizeof(char*));
	    structs[i].opt_info = NULL;
	}
	structs[count].format_name = NULL;
	structs[count].field_list = NULL;
	struct_list[j] = structs;
    }

    count = 0;
    while (out_format_list && (out_format_list[count].format_name != NULL)) count++;
    out_structs = malloc(sizeof(out_structs[0]) * (count + 1));
    for (i = 0; i < count; i++) {
	out_structs[i].format_name = out_format_list[i].format_name;
	out_structs[i].field_list = out_format_list[i].field_list;
	out_structs[i].struct_size = struct_size_field_list(out_structs[i].field_list, (int)sizeof(char*));
	out_structs[i].opt_info = NULL;
    }
    out_structs[count].format_name = NULL;
    out_structs[count].field_list = NULL;
    return create_multityped_action_spec(struct_list, function);
}